

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O2

void __thiscall Circuit::output_gate(Circuit *this,ostream *s,uint i)

{
  GateType GVar1;
  pointer pvVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  
  GVar1 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
          super__Vector_impl_data._M_start[i];
  if (GVar1 == EQW) {
    poVar4 = std::operator<<(s,"1 1 ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    s = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pcVar5 = " EQW";
  }
  else if (GVar1 == EQ) {
    poVar4 = std::operator<<(s,"1 1 ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    s = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pcVar5 = " EQ";
  }
  else if (GVar1 == INV) {
    poVar4 = std::operator<<(s,"1 1 ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    s = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pcVar5 = " INV";
  }
  else {
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," ");
    for (uVar3 = 0;
        pvVar2 = (this->GateI).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)uVar3 <
        (ulong)((long)*(pointer *)
                       ((long)&pvVar2[i].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar2[i].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data >> 2); uVar3 = uVar3 + 1) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
      std::operator<<(poVar4," ");
    }
    for (uVar3 = 0;
        pvVar2 = (this->GateO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)uVar3 <
        (ulong)((long)*(pointer *)
                       ((long)&pvVar2[i].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) -
                *(long *)&pvVar2[i].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data >> 2); uVar3 = uVar3 + 1) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
      std::operator<<(poVar4," ");
    }
    GVar1 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
            super__Vector_impl_data._M_start[i];
    if (GVar1 == AND) {
      pcVar5 = "AND";
    }
    else if (GVar1 == MAND) {
      pcVar5 = "MAND";
    }
    else {
      pcVar5 = "XOR";
    }
  }
  std::operator<<(s,pcVar5);
  return;
}

Assistant:

void Circuit::output_gate(ostream &s, unsigned int i) const {
  if (GateT[i] == INV) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " INV";
  } else if (GateT[i] == EQ) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " EQ";
  } else if (GateT[i] == EQW) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " EQW";
  } else {
    s << GateI[i].size() << " " << GateO[i].size() << " ";
    for (unsigned int j = 0; j < GateI[i].size(); j++) {
      s << GateI[i][j] << " ";
    }
    for (unsigned int j = 0; j < GateO[i].size(); j++) {
      s << GateO[i][j] << " ";
    }
    if (GateT[i] == AND) {
      s << "AND";
    } else if (GateT[i] == MAND) {
      s << "MAND";
    } else {
      s << "XOR";
    }
  }
}